

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FboCases::MixTest::MixTest
          (MixTest *this,Context *context,FboConfig *config,bool npot)

{
  undefined7 in_register_00000009;
  char *__s;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s = "mix_";
  if ((int)CONCAT71(in_register_00000009,npot) != 0) {
    __s = "mix_npot_";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_81);
  FboConfig::getName_abi_cxx11_(&local_80,config);
  std::operator+(&local_40,&local_60,&local_80);
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,local_40._M_dataplus._M_p,
             "Use two fbos as sources in draw operation",config);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e23548;
  uVar4 = (uint)npot;
  uVar1 = (int)(uVar4 << 0x1f) >> 0x1f;
  uVar2 = (int)(uVar4 << 0x1f) >> 0x1f;
  uVar3 = (int)(uVar4 << 0x1f) >> 0x1f;
  uVar4 = (int)(uVar4 << 0x1f) >> 0x1f;
  this->m_fboAWidth = uVar1 & 0x7f | ~uVar1 & 0x80;
  this->m_fboAHeight = uVar2 & 0x5f | ~uVar2 & 0x80;
  this->m_fboBWidth = uVar3 & 0x37 | ~uVar3 & 0x40;
  this->m_fboBHeight = uVar4 & 0x3f | ~uVar4 & 0x40;
  return;
}

Assistant:

MixTest::MixTest (Context& context, const FboConfig& config, bool npot)
	: FboRenderCase	(context, (string(npot ? "mix_npot_" : "mix_") + config.getName()).c_str(), "Use two fbos as sources in draw operation", config)
	, m_fboAWidth	(npot ? 127 : 128)
	, m_fboAHeight	(npot ?  95 : 128)
	, m_fboBWidth	(npot ?  55 :  64)
	, m_fboBHeight	(npot ?  63 :  64)
{
}